

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.h
# Opt level: O2

void __thiscall
cmSetTargetPropertiesCommand::~cmSetTargetPropertiesCommand(cmSetTargetPropertiesCommand *this)

{
  cmCommand::~cmCommand(&this->super_cmCommand);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmSetTargetPropertiesCommand; }